

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O3

int IPdr_ManCheckClauses(Pdr_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (ulong)p->vSolvers->nSize;
  if (1 < (long)uVar3) {
    uVar5 = 1;
    do {
      if ((long)p->vClauses->nSize <= (long)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar1 = p->vClauses->pArray[uVar5];
      if (0 < *(int *)((long)pvVar1 + 4)) {
        uVar4 = 0;
        do {
          iVar2 = Pdr_ManCheckCube(p,(int)uVar5 + -1,
                                   *(Pdr_Set_t **)(*(long *)((long)pvVar1 + 8) + uVar4 * 8),
                                   (Pdr_Set_t **)0x0,0,0,1);
          if (iVar2 == 0) {
            printf("Cube[%d][%d] not inductive!\n",uVar5 & 0xffffffff,uVar4 & 0xffffffff);
          }
          else if (iVar2 == -1) {
            return -1;
          }
          uVar4 = uVar4 + 1;
        } while ((long)uVar4 < (long)*(int *)((long)pvVar1 + 4));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
  }
  return 1;
}

Assistant:

int IPdr_ManCheckClauses( Pdr_Man_t * p )
{
    Pdr_Set_t * pCubeK;
    Vec_Ptr_t * vArrayK;
    int j, k, RetValue, kMax = Vec_PtrSize(p->vSolvers);
    int iStartFrame = 1;
    int counter = 0;

    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, k, iStartFrame, kMax )
    {
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
        {
            ++counter;
            RetValue = Pdr_ManCheckCube( p, k - 1, pCubeK, NULL, 0, 0, 1 );

            if ( !RetValue ) {
                printf( "Cube[%d][%d] not inductive!\n", k, j );
            }

            if ( RetValue == -1 )
                return -1;
        }
    }

    return 1;
}